

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.c
# Opt level: O3

ZyanStatus
ZydisStringAppendHexU
          (ZyanString *string,ZyanU64 value,ZyanU8 padding_length,ZyanBool force_leading_number,
          ZyanBool uppercase,ZyanStringView *prefix,ZyanStringView *suffix)

{
  ZyanUSize ZVar1;
  ZyanUSize ZVar2;
  bool bVar3;
  byte bVar4;
  ZyanStatus ZVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  undefined1 *__s;
  long lVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  
  if (prefix == (ZyanStringView *)0x0) {
    if (string == (ZyanString *)0x0) {
      __assert_fail("string",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                    ,0xed,
                    "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                   );
    }
  }
  else {
    if (string == (ZyanString *)0x0) {
      __assert_fail("destination && source",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0x86,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
    }
    if ((string->vector).allocator != (ZyanAllocator *)0x0) goto LAB_001233e6;
    ZVar1 = (string->vector).size;
    if ((ZVar1 == 0) || (ZVar2 = (prefix->string).vector.size, ZVar2 == 0)) goto LAB_001233c7;
    if ((string->vector).capacity < (ZVar1 + ZVar2) - 1) {
      return 0x80100009;
    }
    memcpy((void *)((long)(string->vector).data + (ZVar1 - 1)),(prefix->string).vector.data,
           ZVar2 - 1);
    ZVar1 = (prefix->string).vector.size;
    ZVar2 = (string->vector).size;
    (string->vector).size = (ZVar1 + ZVar2) - 1;
    *(undefined1 *)((long)(string->vector).data + ZVar1 + ZVar2 + -2) = 0;
  }
  if ((string->vector).allocator != (ZyanAllocator *)0x0) {
    __assert_fail("!string->vector.allocator",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                  ,0xee,
                  "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  ZVar1 = (string->vector).size;
  uVar7 = (string->vector).capacity - ZVar1;
  uVar8 = (ulong)padding_length;
  ZVar5 = 0x80100009;
  if (uVar8 <= uVar7) {
    if (value == 0) {
      bVar4 = 1;
      if (1 < padding_length) {
        bVar4 = padding_length;
      }
      uVar8 = (ulong)bVar4;
      if (uVar7 < uVar8) {
        return 0x80100009;
      }
      memset((void *)((long)(string->vector).data + (ZVar1 - 1)),0x30,uVar8);
    }
    else {
      lVar11 = (ulong)(value >> 0x20 != 0) * 8 + 7;
      pcVar9 = "0123456789ABCDEF";
      if (uppercase == '\0') {
        pcVar9 = "0123456789abcdef";
      }
      bVar12 = ~(byte)lVar11 + padding_length;
      iVar10 = (int)lVar11 * 4;
      __s = (undefined1 *)0x0;
      bVar4 = 0;
      do {
        uVar6 = value >> ((byte)iVar10 & 0x3f);
        if (bVar4 == 0) {
          if ((uVar6 & 0xf) != 0) {
            bVar14 = force_leading_number != '\0';
            bVar13 = 9 < ((byte)uVar6 & 0xf);
            bVar3 = (long)uVar8 <= lVar11;
            if (uVar7 <= ((uint)((bVar3 && bVar14) && bVar13) + (int)lVar11 & 0xff)) {
              return 0x80100009;
            }
            __s = (undefined1 *)((long)(string->vector).data + (ZVar1 - 1));
            if ((bVar3 && bVar14) && bVar13) {
              *__s = 0x30;
            }
            bVar4 = (bVar3 && bVar14) && bVar13;
            if (lVar11 < (long)uVar8) {
              memset(__s,0x30,(ulong)bVar12);
              bVar4 = bVar12;
            }
            goto LAB_0012320a;
          }
          bVar4 = 0;
        }
        else {
          if (__s == (undefined1 *)0x0) {
            __assert_fail("buffer",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                          ,0x124,
                          "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                         );
          }
LAB_0012320a:
          __s[bVar4] = pcVar9[(uint)uVar6 & 0xf];
          bVar4 = bVar4 + 1;
        }
        bVar12 = bVar12 + 1;
        iVar10 = iVar10 + -4;
        bVar3 = 0 < lVar11;
        lVar11 = lVar11 + -1;
      } while (bVar3);
      uVar8 = (ulong)bVar4;
    }
    (string->vector).size = uVar8 + ZVar1;
    *(undefined1 *)((long)(string->vector).data + ((uVar8 + ZVar1) - 1)) = 0;
    if (suffix != (ZyanStringView *)0x0) {
      if ((string->vector).allocator != (ZyanAllocator *)0x0) {
LAB_001233e6:
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0x87,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
      }
      ZVar1 = (string->vector).size;
      if ((ZVar1 == 0) || (ZVar2 = (suffix->string).vector.size, ZVar2 == 0)) {
LAB_001233c7:
        __assert_fail("destination->vector.size && source->string.vector.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0x88,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
      }
      if ((string->vector).capacity < (ZVar1 + ZVar2) - 1) {
        return 0x80100009;
      }
      memcpy((void *)((long)(string->vector).data + (ZVar1 - 1)),(suffix->string).vector.data,
             ZVar2 - 1);
      ZVar1 = (suffix->string).vector.size;
      ZVar2 = (string->vector).size;
      (string->vector).size = (ZVar1 + ZVar2) - 1;
      *(undefined1 *)((long)(string->vector).data + ZVar1 + ZVar2 + -2) = 0;
    }
    ZVar5 = 0x100000;
  }
  return ZVar5;
}

Assistant:

ZyanStatus ZydisStringAppendHexU(ZyanString* string, ZyanU64 value, ZyanU8 padding_length,
    ZyanBool force_leading_number, ZyanBool uppercase, const ZyanStringView* prefix,
    const ZyanStringView* suffix)
{
    if (prefix)
    {
        ZYAN_CHECK(ZydisStringAppend(string, prefix));
    }

#if defined(ZYAN_X64) || defined(ZYAN_AARCH64) || defined(ZYAN_PPC64) || defined(ZYAN_RISCV64) || defined(ZYAN_LOONGARCH)
    ZYAN_CHECK(ZydisStringAppendHexU64(string, value, padding_length, force_leading_number,
        uppercase));
#else
    if (value & 0xFFFFFFFF00000000)
    {
        ZYAN_CHECK(ZydisStringAppendHexU64(string, value, padding_length, force_leading_number,
            uppercase));
    }
    else
    {
        ZYAN_CHECK(ZydisStringAppendHexU32(string, (ZyanU32)value, padding_length,
            force_leading_number, uppercase));
    }
#endif

    if (suffix)
    {
        return ZydisStringAppend(string, suffix);
    }
    return ZYAN_STATUS_SUCCESS;
}